

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O2

int lj_gc_step_jit(global_State *g,MSize steps)

{
  char cVar1;
  int iVar2;
  TValue *pTVar3;
  int iVar4;
  lua_State *L;
  
  L = (lua_State *)(ulong)(g->jit_L).gcptr32;
  pTVar3 = (TValue *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0xf8);
  L->base = pTVar3;
  L->top = pTVar3 + *(byte *)((ulong)*(uint *)((ulong)pTVar3[-1].u32.lo + 0x10) - 0x39);
  iVar4 = steps + 1;
  do {
    iVar4 = iVar4 + -1;
    if (iVar4 == 0) break;
    iVar2 = lj_gc_step(L);
  } while (iVar2 == 0);
  cVar1 = *(char *)((ulong)(L->glref).ptr32 + 0x29);
  return (int)(cVar1 == '\x05' || cVar1 == '\x02');
}

Assistant:

int LJ_FASTCALL lj_gc_step_jit(global_State *g, MSize steps)
{
  lua_State *L = gco2th(gcref(g->jit_L));
  L->base = mref(G(L)->jit_base, TValue);
  L->top = curr_topL(L);
  while (steps-- > 0 && lj_gc_step(L) == 0)
    ;
  /* Return 1 to force a trace exit. */
  return (G(L)->gc.state == GCSatomic || G(L)->gc.state == GCSfinalize);
}